

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::VarConcat::replace_var
          (VarConcat *this,shared_ptr<kratos::Var> *target,shared_ptr<kratos::Var> *item)

{
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_equals_val<kratos::Var*const>>
                    ((this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    *_Var1._M_current = (item->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  return;
}

Assistant:

void VarConcat::replace_var(const std::shared_ptr<Var> &target, const std::shared_ptr<Var> &item) {
    auto pos = std::find(vars_.begin(), vars_.end(), target.get());
    if (pos != vars_.end()) {
        *pos = item.get();
    }
}